

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Matchers::Impl::StdString::StartsWith::match(StartsWith *this,string *expr)

{
  bool bVar1;
  undefined1 local_38 [40];
  string *expr_local;
  StartsWith *this_local;
  
  local_38._32_8_ = expr;
  expr_local = (string *)this;
  CasedString::adjustString((CasedString *)local_38,(string *)&this->m_data);
  bVar1 = startsWith((string *)local_38,&(this->m_data).m_str);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return startsWith( m_data.adjustString( expr ), m_data.m_str );
            }